

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_1::getVectorsFromComps(Functions *gl,deUint32 pname)

{
  GLenum err;
  TestError *this;
  int value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  code *local_30;
  deUint32 local_28;
  
  value = -1;
  (*gl->getIntegerv)(pname,&value);
  err = (*gl->getError)();
  local_30 = glu::getGettableStateName;
  local_28 = pname;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_50,&local_30);
  std::operator+(&local_90,"glGetIntegerv(",&local_50);
  std::operator+(&local_70,&local_90,")");
  glu::checkError(err,local_70._M_dataplus._M_p,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                  ,0x41);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  if ((value & 3U) == 0) {
    return value >> 2;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  local_30 = glu::getGettableStateName;
  local_28 = pname;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_50,&local_30);
  std::operator+(&local_90,"Expected ",&local_50);
  std::operator+(&local_70,&local_90," to be divisible by 4");
  tcu::TestError::TestError
            (this,local_70._M_dataplus._M_p,"value%4 == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
             ,0x42);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static int getVectorsFromComps (const glw::Functions& gl, deUint32 pname)
{
	int value = -1;
	gl.getIntegerv(pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegerv(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	TCU_CHECK_MSG(value%4 == 0, ("Expected " + glu::getGettableStateStr((int)pname).toString() + " to be divisible by 4").c_str());
	return value/4;
}